

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::ObjectSet(VirtualMachine *this)

{
  mapped_type *pmVar1;
  Variable VVar2;
  Variable VVar3;
  Variable VVar4;
  Variable first;
  Variable second;
  Variable third;
  VirtualMachine *this_local;
  
  VVar2 = popOpStack(this);
  VVar3 = popOpStack(this);
  VVar4 = popOpStack(this);
  if (VVar4.type == Object) {
    if (VVar3.type == String) {
      pmVar1 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>_>
               ::operator[](&(VVar4.field_1.objectValue)->properties,
                            (key_type *)VVar3.field_1.objectValue);
      *(ulong *)pmVar1 = CONCAT44(second.field_1.integerValue._4_4_,VVar2.type);
      (pmVar1->field_1).integerValue = (int64_t)VVar2.field_1;
      pushUndefined(this);
      advance(this);
    }
    else {
      pushUndefined(this);
      advance(this);
    }
  }
  else {
    pushUndefined(this);
    advance(this);
  }
  return;
}

Assistant:

void runtime::VirtualMachine::ObjectSet() {
  Variable third = this->popOpStack();
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (first.type != VariableType::Object) {
    this->pushUndefined();
    this->advance();
    return;
  }

  if (second.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  first.objectValue->properties[*second.stringValue] = third;
  this->pushUndefined();
  this->advance();
}